

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_SetWorkingDirectory(cmsysProcess *cp,char *dir)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  pcVar3 = cp->WorkingDirectory;
  if (pcVar3 == dir) {
    return 1;
  }
  if (dir == (char *)0x0 || pcVar3 == (char *)0x0) {
    if (pcVar3 == (char *)0x0) goto LAB_0013fe61;
  }
  else {
    iVar1 = strcmp(pcVar3,dir);
    if (iVar1 == 0) {
      return 1;
    }
  }
  free(pcVar3);
  cp->WorkingDirectory = (char *)0x0;
LAB_0013fe61:
  if (dir != (char *)0x0) {
    sVar2 = strlen(dir);
    pcVar3 = (char *)malloc(sVar2 + 1);
    cp->WorkingDirectory = pcVar3;
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    strcpy(pcVar3,dir);
  }
  return 1;
}

Assistant:

int kwsysProcess_SetWorkingDirectory(kwsysProcess* cp, const char* dir)
{
  if(!cp)
    {
    return 0;
    }
  if(cp->WorkingDirectory == dir)
    {
    return 1;
    }
  if(cp->WorkingDirectory && dir && strcmp(cp->WorkingDirectory, dir) == 0)
    {
    return 1;
    }
  if(cp->WorkingDirectory)
    {
    free(cp->WorkingDirectory);
    cp->WorkingDirectory = 0;
    }
  if(dir)
    {
    cp->WorkingDirectory = (char*)malloc(strlen(dir) + 1);
    if(!cp->WorkingDirectory)
      {
      return 0;
      }
    strcpy(cp->WorkingDirectory, dir);
    }
  return 1;
}